

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int push_const_val(c2m_ctx_t c2m_ctx,node_t_conflict r,op_t *res)

{
  longdouble ld;
  type *type;
  MIR_context_t ctx;
  uint64_t u;
  uint uVar1;
  MIR_type_t MVar2;
  int iVar3;
  undefined8 uStack_b0;
  MIR_op_t local_78;
  void *local_48;
  undefined8 uStack_40;
  int64_t iStack_38;
  char *pcStack_30;
  undefined8 uStack_28;
  MIR_disp_t MStack_20;
  
  if ((r->code & N_I) == N_IGNORE) {
    return 0;
  }
  type = (type *)(r->op_link).next;
  ctx = c2m_ctx->ctx;
  if (type->mode == TM_BASIC) {
    uVar1 = (type->u).basic_type - TP_FLOAT;
    if (uVar1 < 3) {
      MVar2 = get_mir_type(c2m_ctx,type);
      ld = *(longdouble *)(r + 1);
      if (MVar2 == MIR_T_D) {
        MIR_new_double_op(ctx,(double)ld);
        local_48 = local_78.data;
        uStack_40 = local_78._8_8_;
        iStack_38 = local_78.u.i;
        pcStack_30 = local_78.u.str.s;
        uStack_28 = local_78.u._16_8_;
        MStack_20 = local_78.u.mem.disp;
      }
      else if (MVar2 == MIR_T_F) {
        MIR_new_float_op(ctx,(float)ld);
        local_48 = local_78.data;
        uStack_40 = local_78._8_8_;
        iStack_38 = local_78.u.i;
        pcStack_30 = local_78.u.str.s;
        uStack_28 = local_78.u._16_8_;
        MStack_20 = local_78.u.mem.disp;
      }
      else {
        MIR_new_ldouble_op(&local_78,ctx,ld);
        local_48 = local_78.data;
        uStack_40 = local_78._8_8_;
        iStack_38 = local_78.u.i;
        pcStack_30 = local_78.u.str.s;
        uStack_28 = local_78.u._16_8_;
        MStack_20 = local_78.u.mem.disp;
      }
      goto LAB_001a48d2;
    }
    if (uVar1 < 0xfffffff4) goto LAB_001a487e;
  }
  else if ((type->mode & ~TM_BASIC) != TM_ENUM) {
LAB_001a487e:
    __assert_fail("integer_type_p (e->type) || e->type->mode == TM_PTR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x28d6,"int push_const_val(c2m_ctx_t, node_t, op_t *)");
  }
  iVar3 = signed_integer_type_p(type);
  u._0_4_ = r[1].code;
  u._4_4_ = r[1].uid;
  if (iVar3 == 0) {
    MIR_new_uint_op(ctx,u);
  }
  else {
    MIR_new_int_op(ctx,u);
  }
LAB_001a48d2:
  res->decl = (decl_t)0x0;
  *(undefined8 *)&res->field_0x8 = uStack_b0;
  (res->mir_op).data = local_48;
  *(undefined8 *)&(res->mir_op).field_0x8 = uStack_40;
  (res->mir_op).u.i = iStack_38;
  (res->mir_op).u.i = iStack_38;
  (res->mir_op).u.str.s = pcStack_30;
  *(undefined8 *)((long)&(res->mir_op).u + 0x10) = uStack_28;
  (res->mir_op).u.mem.disp = MStack_20;
  return 1;
}

Assistant:

static int push_const_val (c2m_ctx_t c2m_ctx, node_t r, op_t *res) {
  MIR_context_t ctx = c2m_ctx->ctx;
  struct expr *e = (struct expr *) r->attr;
  MIR_type_t mir_type;

  if (!e->const_p) return FALSE;
  if (floating_type_p (e->type)) {
    /* MIR support only IEEE float and double */
    mir_type = get_mir_type (c2m_ctx, e->type);
    *res = new_op (NULL, (mir_type == MIR_T_F   ? MIR_new_float_op (ctx, (float) e->c.d_val)
                          : mir_type == MIR_T_D ? MIR_new_double_op (ctx, e->c.d_val)
                                                : MIR_new_ldouble_op (ctx, e->c.d_val)));
  } else {
    assert (integer_type_p (e->type) || e->type->mode == TM_PTR);
    *res = new_op (NULL, (signed_integer_type_p (e->type) ? MIR_new_int_op (ctx, e->c.i_val)
                                                          : MIR_new_uint_op (ctx, e->c.u_val)));
  }
  return TRUE;
}